

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int hgeti4(char *hstring,char *keyword,int *ival)

{
  size_t sVar1;
  int *in_RDX;
  double dVar2;
  char val [30];
  int minint;
  double dval;
  char *value;
  char *in_stack_000000e0;
  char *in_stack_000000e8;
  char acStack_58 [36];
  int local_34;
  char *local_28;
  int *local_20;
  int local_4;
  
  local_20 = in_RDX;
  local_28 = hgetc(in_stack_000000e8,in_stack_000000e0);
  if (local_28 == (char *)0x0) {
    local_4 = 0;
  }
  else {
    local_34 = -0x80000000;
    sVar1 = strlen(local_28);
    if (sVar1 < 0x1e) {
      strcpy(acStack_58,local_28);
      dVar2 = atof(acStack_58);
      if (dVar2 + 0.001 <= 2147483647.0) {
        if (dVar2 < 0.0) {
          if ((double)local_34 <= dVar2 - 0.001) {
            *local_20 = (int)(dVar2 - 0.001);
          }
          else {
            *local_20 = local_34;
          }
        }
        else {
          *local_20 = (int)(dVar2 + 0.001);
        }
      }
      else {
        *local_20 = 0x7fffffff;
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
hgeti4 (hstring,keyword,ival)

char *hstring;	/* character string containing FITS header information
		   in the format <keyword>= <value> {/ <comment>} */
char *keyword;	/* character string containing the name of the keyword
		   the value of which is returned.  hget searches for a
		   line beginning with this string.  if "[n]" is present,
		   the n'th token in the value is returned.
		   (the first 8 characters must be unique) */
int *ival;
{
char *value;
double dval;
int minint;
char val[30]; 

/* Get value and comment from header string */
	value = hgetc (hstring,keyword);

/* Translate value from ASCII to binary */
	if (value != NULL) {
	    minint = -MAXINT - 1;
            if (strlen(value) > 29)
               return(0);
	    strcpy (val, value);
	    dval = atof (val);
	    if (dval+0.001 > MAXINT)
		*ival = MAXINT;
	    else if (dval >= 0)
		*ival = (int) (dval + 0.001);
	    else if (dval-0.001 < minint)
		*ival = minint;
	    else
		*ival = (int) (dval - 0.001);
	    return (1);
	    }
	else {
	    return (0);
	    }
}